

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
spirv_cross::Bitset::for_each_bit<spirv_cross::Parser::parse(spirv_cross::Instruction_const&)::__0>
          (Bitset *this,anon_class_24_3_d1ce3eef *op)

{
  bool bVar1;
  size_type count;
  reference t;
  uint *puVar2;
  uint *__last;
  uint *v_1;
  uint *__end2_1;
  uint *__begin2_1;
  SmallVector<unsigned_int,_8UL> *__range2_1;
  value_type *v;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  SmallVector<unsigned_int,_8UL> bits;
  uint32_t i;
  anon_class_24_3_d1ce3eef *op_local;
  Bitset *this_local;
  
  bits.stack_storage.aligned_char[0x1c] = '\0';
  bits.stack_storage.aligned_char[0x1d] = '\0';
  bits.stack_storage.aligned_char[0x1e] = '\0';
  bits.stack_storage.aligned_char[0x1f] = '\0';
  for (; (uint)bits.stack_storage.aligned_char._28_4_ < 0x40;
      bits.stack_storage.aligned_char._28_4_ = bits.stack_storage.aligned_char._28_4_ + 1) {
    if ((this->lower & 1L << (bits.stack_storage.aligned_char[0x1c] & 0x3f)) != 0) {
      Parser::parse::anon_class_24_3_d1ce3eef::operator()(op,bits.stack_storage.aligned_char._28_4_)
      ;
    }
  }
  bVar1 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::empty(&this->higher);
  if (!bVar1) {
    SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)&__range2);
    count = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::size(&this->higher);
    SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&__range2,count);
    __end2.super__Node_iterator_base<unsigned_int,_false>._M_cur =
         (_Node_iterator_base<unsigned_int,_false>)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::begin(&this->higher);
    v = (value_type *)
        ::std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::end(&this->higher);
    while (bVar1 = ::std::__detail::operator!=
                             ((_Node_iterator_base<unsigned_int,_false> *)&__end2,
                              (_Node_iterator_base<unsigned_int,_false> *)&v), bVar1) {
      t = ::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*
                    ((_Node_const_iterator<unsigned_int,_true,_false> *)&__end2);
      SmallVector<unsigned_int,_8UL>::push_back((SmallVector<unsigned_int,_8UL> *)&__range2,t);
      ::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++
                ((_Node_const_iterator<unsigned_int,_true,_false> *)&__end2);
    }
    puVar2 = ::std::begin<spirv_cross::SmallVector<unsigned_int,8ul>>
                       ((SmallVector<unsigned_int,_8UL> *)&__range2);
    __last = ::std::end<spirv_cross::SmallVector<unsigned_int,8ul>>
                       ((SmallVector<unsigned_int,_8UL> *)&__range2);
    ::std::sort<unsigned_int*>(puVar2,__last);
    __end2_1 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)&__range2);
    puVar2 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)&__range2);
    for (; __end2_1 != puVar2; __end2_1 = __end2_1 + 1) {
      Parser::parse::anon_class_24_3_d1ce3eef::operator()(op,*__end2_1);
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&__range2);
  }
  return;
}

Assistant:

void for_each_bit(const Op &op) const
	{
		// TODO: Add ctz-based iteration.
		for (uint32_t i = 0; i < 64; i++)
		{
			if (lower & (1ull << i))
				op(i);
		}

		if (higher.empty())
			return;

		// Need to enforce an order here for reproducible results,
		// but hitting this path should happen extremely rarely, so having this slow path is fine.
		SmallVector<uint32_t> bits;
		bits.reserve(higher.size());
		for (auto &v : higher)
			bits.push_back(v);
		std::sort(std::begin(bits), std::end(bits));

		for (auto &v : bits)
			op(v);
	}